

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

Vec_Int_t * Gia_ManCofVars(Gia_Man_t *p,int nFanLim)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVars;
  int nFanLim_local;
  Gia_Man_t *p_local;
  
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(100);
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar2 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsCand(pGStack_28);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(p,pGStack_28), nFanLim <= iVar1)) {
      Vec_IntPush(p_00,local_2c);
    }
    local_2c = local_2c + 1;
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCofVars( Gia_Man_t * p, int nFanLim )
{
    Vec_Int_t * vVars;
    Gia_Obj_t * pObj;
    int i;
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    vVars = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCand(pObj) && Gia_ObjRefNum(p, pObj) >= nFanLim )
            Vec_IntPush( vVars, i );
    ABC_FREE( p->pRefs );
    return vVars;
}